

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

int __thiscall
FadBinaryAdd<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>_>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>_>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>_>_>_>
::size(FadBinaryAdd<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>_>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>_>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>_>_>_>
       *this)

{
  int iVar1;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>
  *pFVar2;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>
  *pFVar3;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>
  *pFVar4;
  int iVar5;
  int iVar6;
  
  iVar5 = FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>_>_>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>_>_>_>
          ::size(&this->left_->fadexpr_);
  pFVar2 = (this->right_->fadexpr_).left_;
  pFVar3 = (pFVar2->fadexpr_).left_;
  pFVar4 = (pFVar3->fadexpr_).left_;
  iVar1 = *(int *)(*(long *)(*(long *)&pFVar4->fadexpr_ + 0x18) + 0x28);
  iVar6 = ((*(Fad<Fad<double>_> **)((long)&pFVar4->fadexpr_ + 8))->dx_).num_elts;
  if (iVar6 < iVar1) {
    iVar6 = iVar1;
  }
  iVar1 = (((pFVar3->fadexpr_).right_)->dx_).num_elts;
  if (iVar6 <= iVar1) {
    iVar6 = iVar1;
  }
  iVar1 = (((pFVar2->fadexpr_).right_)->dx_).num_elts;
  if (iVar6 <= iVar1) {
    iVar6 = iVar1;
  }
  iVar1 = (((((this->right_->fadexpr_).right_)->fadexpr_).right_)->dx_).num_elts;
  if (iVar6 <= iVar1) {
    iVar6 = iVar1;
  }
  if (iVar5 <= iVar6) {
    iVar5 = iVar6;
  }
  return iVar5;
}

Assistant:

int size() const {
    int lsz = left_.size(), rsz = right_.size();
    return std::max(lsz, rsz);
  }